

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xpath(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  xmlXPathObjectPtr pxVar38;
  xmlNodePtr pxVar39;
  undefined8 uVar40;
  xmlNodePtr pxVar41;
  xmlDocPtr pxVar42;
  int nr;
  int extraout_EDX;
  int nr_00;
  int nr_01;
  undefined4 uVar43;
  int nr_02;
  int nr_03;
  int nr_04;
  int test_ret_1;
  int iVar44;
  undefined8 *puVar45;
  int n_val;
  uint uVar46;
  xmlNodePtr in_RSI;
  ulong uVar47;
  int test_ret;
  int iVar48;
  uint uVar49;
  int test_ret_5;
  undefined4 *puVar50;
  ulong uVar51;
  int test_ret_3;
  int test_ret_11;
  undefined1 auVar52 [12];
  int test_ret_19;
  int test_ret_10;
  int test_ret_9;
  int test_ret_20;
  int local_48;
  int local_44;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xpath : 32 of 41 functions ...");
  }
  puVar50 = &DAT_00158240;
  pxVar39 = (xmlNodePtr)0x0;
  iVar48 = 0;
  do {
    iVar1 = xmlMemBlocks();
    xmlXPathCastBooleanToNumber(*puVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    iVar3 = (int)pxVar39;
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastBooleanToNumber",(ulong)(uint)(iVar2 - iVar1));
      iVar48 = iVar48 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar39;
    }
    uVar46 = iVar3 + 1;
    pxVar39 = (xmlNodePtr)(ulong)uVar46;
    puVar50 = puVar50 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  puVar50 = &DAT_00158240;
  uVar46 = 0;
  iVar1 = 0;
  do {
    iVar2 = xmlMemBlocks();
    lVar37 = xmlXPathCastBooleanToString(*puVar50);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastBooleanToString",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
    puVar50 = puVar50 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlXPathCastNodeSetToBoolean(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToBoolean");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlXPathCastNodeSetToNumber(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToNumber");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar37 = xmlXPathCastNodeSetToString(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToString");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar44 = 0;
  do {
    iVar9 = (int)in_RSI;
    iVar8 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar46,iVar9);
    xmlXPathCastNodeToNumber(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar46,in_RSI,nr);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNodeToNumber",(ulong)(uint)(iVar9 - iVar8));
      iVar44 = iVar44 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 3);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar8 = 0;
  do {
    iVar9 = (int)in_RSI;
    iVar10 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar46,iVar9);
    auVar52 = xmlXPathCastNodeToString(in_RSI);
    iVar9 = auVar52._8_4_;
    if (auVar52._0_8_ != 0) {
      (*_xmlFree)(auVar52._0_8_);
      iVar9 = extraout_EDX;
    }
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar46,in_RSI,iVar9);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar10 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNodeToString",(ulong)(uint)(iVar9 - iVar10));
      iVar8 = iVar8 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 3);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (uVar46 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar46 != 2) {
        if (uVar46 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathCastNumberToBoolean(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNumberToBoolean",(ulong)(uint)(iVar11 - iVar10)
            );
      iVar9 = iVar9 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar46 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar46 != 2) {
        if (uVar46 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    lVar37 = xmlXPathCastNumberToString(uVar40);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNumberToString",(ulong)(uint)(iVar12 - iVar11))
      ;
      iVar10 = iVar10 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  puVar45 = &DAT_0015ad60;
  uVar46 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    if (uVar46 < 4) {
      uVar40 = *puVar45;
    }
    else {
      uVar40 = 0;
    }
    xmlXPathCastStringToBoolean(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastStringToBoolean",(ulong)(uint)(iVar13 - iVar12)
            );
      iVar11 = iVar11 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  puVar45 = &DAT_0015ad60;
  uVar46 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    if (uVar46 < 4) {
      uVar40 = *puVar45;
    }
    else {
      uVar40 = 0;
    }
    xmlXPathCastStringToNumber(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastStringToNumber",(ulong)(uint)(iVar14 - iVar13))
      ;
      iVar12 = iVar12 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)in_RSI);
    xmlXPathCastToBoolean(pxVar38);
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToBoolean",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)in_RSI);
    xmlXPathCastToNumber(pxVar38);
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToNumber",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  local_44 = 0;
  do {
    iVar15 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)in_RSI);
    lVar37 = xmlXPathCastToString(pxVar38);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToString",(ulong)(uint)(iVar16 - iVar15));
      local_44 = local_44 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar46 = 0;
  do {
    uVar49 = 0;
    do {
      iVar17 = (int)in_RSI;
      iVar16 = xmlMemBlocks();
      pxVar39 = gen_xmlNodePtr(uVar46,iVar17);
      in_RSI = gen_xmlNodePtr(uVar49,iVar17);
      xmlXPathCmpNodes(pxVar39,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar46,pxVar39,nr_00);
      des_xmlNodePtr(uVar49,in_RSI,nr_01);
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCmpNodes",(ulong)(uint)(iVar17 - iVar16));
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar46);
        in_RSI = (xmlNodePtr)(ulong)uVar49;
        printf(" %d");
        putchar(10);
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 != 3);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 3);
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  uVar40 = xmlXPathCompiledEval(0,0);
  xmlXPathFreeObject(uVar40);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    iVar18 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCompiledEval",(ulong)(uint)(iVar18 - iVar16));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar18 = xmlMemBlocks();
  xmlXPathCompiledEvalToBoolean(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar19 = xmlMemBlocks();
  if (iVar18 != iVar19) {
    iVar20 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCompiledEvalToBoolean",(ulong)(uint)(iVar20 - iVar18)
          );
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar46 = 0;
  do {
    uVar51 = 0;
    do {
      uVar49 = 0;
      puVar50 = &DAT_00158240;
      do {
        iVar21 = xmlMemBlocks();
        uVar43 = 0xffffffff;
        uVar47 = 0xffffffff;
        if (uVar46 < 4) {
          uVar47 = (ulong)(uint)(&DAT_00158240)[uVar46];
        }
        if ((uint)uVar51 < 4) {
          uVar43 = (&DAT_00158240)[uVar51];
        }
        xmlXPathContextSetCache(0,uVar47,uVar43,*puVar50);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar22 = xmlMemBlocks();
        if (iVar21 != iVar22) {
          iVar22 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathContextSetCache",(ulong)(uint)(iVar22 - iVar21)
                );
          iVar20 = iVar20 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar46);
          printf(" %d",uVar51);
          uVar47 = (ulong)uVar49;
          printf(" %d");
          putchar(10);
        }
        uVar49 = uVar49 + 1;
        puVar50 = puVar50 + 1;
      } while (uVar49 != 4);
      uVar49 = (uint)uVar51 + 1;
      uVar51 = (ulong)uVar49;
    } while (uVar49 != 4);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)uVar47);
    uVar40 = xmlXPathConvertBoolean(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConvertBoolean",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      uVar47 = (ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar22 = 0;
  do {
    iVar23 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)uVar47);
    uVar40 = xmlXPathConvertNumber(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConvertNumber",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      uVar47 = (ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar23 = 0;
  do {
    iVar24 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)uVar47);
    uVar40 = xmlXPathConvertString(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConvertString",(ulong)(uint)(iVar25 - iVar24));
      iVar23 = iVar23 + 1;
      uVar47 = (ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  puVar45 = &DAT_0015ad60;
  iVar24 = 0;
  uVar46 = 0;
  do {
    iVar25 = xmlMemBlocks();
    if (uVar46 < 4) {
      uVar40 = *puVar45;
    }
    else {
      uVar40 = 0;
    }
    xmlXPathEval(uVar40);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEval",(ulong)(uint)(iVar26 - iVar25));
      iVar24 = iVar24 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  puVar45 = &DAT_0015ad60;
  iVar25 = 0;
  uVar46 = 0;
  do {
    iVar26 = xmlMemBlocks();
    if (uVar46 < 4) {
      uVar40 = *puVar45;
    }
    else {
      uVar40 = 0;
    }
    pxVar39 = (xmlNodePtr)0x0;
    xmlXPathEvalExpression(uVar40);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEvalExpression",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d");
      pxVar39 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
    puVar45 = puVar45 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar26 = 0;
  do {
    iVar28 = (int)pxVar39;
    iVar27 = xmlMemBlocks();
    pxVar41 = (xmlNodePtr)gen_xmlXPathObjectPtr(uVar46,iVar28);
    pxVar39 = pxVar41;
    xmlXPathEvalPredicate(0);
    call_tests = call_tests + 1;
    if (pxVar41 != (xmlNodePtr)0x0) {
      xmlXPathFreeObject(pxVar41);
    }
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEvalPredicate",(ulong)(uint)(iVar28 - iVar27));
      iVar26 = iVar26 + 1;
      printf(" %d",0);
      pxVar39 = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  iVar27 = xmlMemBlocks();
  xmlXPathInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar28 = xmlMemBlocks();
  if (iVar27 != iVar28) {
    iVar29 = xmlMemBlocks();
    pxVar39 = (xmlNodePtr)(ulong)(uint)(iVar29 - iVar27);
    printf("Leak of %d blocks found in xmlXPathInit");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar46 = 0;
  local_48 = 0;
  do {
    iVar29 = xmlMemBlocks();
    if (uVar46 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar46 != 2) {
        if (uVar46 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathIsInf(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar29 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsInf",(ulong)(uint)(iVar30 - iVar29));
      local_48 = local_48 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  uVar46 = 0;
  local_34 = 0;
  do {
    iVar29 = xmlMemBlocks();
    if (uVar46 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar46 != 2) {
        if (uVar46 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathIsNaN(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar29 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsNaN",(ulong)(uint)(iVar30 - iVar29));
      local_34 = local_34 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar46 = 0;
  do {
    puVar45 = &DAT_0015ad60;
    uVar49 = 0;
    do {
      iVar31 = (int)pxVar39;
      iVar30 = xmlMemBlocks();
      pxVar39 = gen_xmlNodePtr(uVar46,iVar31);
      if (uVar49 < 4) {
        uVar40 = *puVar45;
      }
      else {
        uVar40 = 0;
      }
      uVar40 = xmlXPathNodeEval(pxVar39,uVar40,0);
      xmlXPathFreeObject(uVar40);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar46,pxVar39,nr_02);
      xmlResetLastError();
      iVar31 = xmlMemBlocks();
      if (iVar30 != iVar31) {
        iVar31 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeEval",(ulong)(uint)(iVar31 - iVar30));
        iVar29 = iVar29 + 1;
        printf(" %d",(ulong)uVar46);
        printf(" %d");
        pxVar39 = (xmlNodePtr)0x0;
        printf(" %d");
        putchar(10);
      }
      uVar49 = uVar49 + 1;
      puVar45 = puVar45 + 1;
    } while (uVar49 != 5);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 3);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar30 = 0;
  do {
    iVar32 = (int)pxVar39;
    iVar31 = xmlMemBlocks();
    pxVar39 = gen_xmlNodePtr(uVar46,iVar32);
    uVar40 = xmlXPathNodeSetCreate(pxVar39);
    xmlXPathFreeNodeSet(uVar40);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar46,pxVar39,nr_03);
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetCreate",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 3);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar31 = 0;
  do {
    iVar32 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar46,(int)pxVar39);
    uVar40 = xmlXPathObjectCopy(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar33 = xmlMemBlocks();
    if (iVar32 != iVar33) {
      iVar33 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathObjectCopy",(ulong)(uint)(iVar33 - iVar32));
      iVar31 = iVar31 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 5);
  function_tests = function_tests + 1;
  uVar46 = 0;
  iVar32 = 0;
  do {
    iVar33 = xmlMemBlocks();
    pxVar42 = gen_xmlDocPtr(uVar46,(int)pxVar39);
    xmlXPathOrderDocElems(pxVar42);
    call_tests = call_tests + 1;
    if (((pxVar42 != (xmlDocPtr)0x0) && (api_doc != pxVar42)) && (pxVar42->doc != api_doc)) {
      xmlFreeDoc(pxVar42);
    }
    xmlResetLastError();
    iVar34 = xmlMemBlocks();
    if (iVar33 != iVar34) {
      iVar34 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathOrderDocElems",(ulong)(uint)(iVar34 - iVar33));
      iVar32 = iVar32 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar46;
      printf(" %d");
      putchar(10);
    }
    uVar46 = uVar46 + 1;
  } while (uVar46 != 4);
  function_tests = function_tests + 1;
  iVar34 = 0;
  iVar33 = 0;
  do {
    iVar36 = (int)pxVar39;
    iVar35 = xmlMemBlocks();
    pxVar39 = gen_xmlNodePtr(iVar33,iVar36);
    xmlXPathSetContextNode(pxVar39,0);
    call_tests = call_tests + 1;
    des_xmlNodePtr(iVar33,pxVar39,nr_04);
    xmlResetLastError();
    iVar36 = xmlMemBlocks();
    if (iVar35 != iVar36) {
      iVar36 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSetContextNode",(ulong)(uint)(iVar36 - iVar35));
      iVar34 = iVar34 + 1;
      printf(" %d");
      pxVar39 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar33 = iVar33 + 1;
  } while (iVar33 != 3);
  function_tests = function_tests + 1;
  uVar46 = local_44 + iVar15 +
           iVar1 + iVar48 + (uint)(iVar2 != iVar3) + (uint)(iVar4 != iVar5) + (uint)(iVar6 != iVar7)
           + iVar44 + iVar8 + iVar9 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 +
           (uint)(iVar16 != iVar17) + (uint)(iVar18 != iVar19) + iVar20 + iVar21 + iVar22 + iVar23 +
           iVar24 + iVar25 + iVar26 + (uint)(iVar27 != iVar28) + local_48 + local_34 + iVar29 +
           iVar30 + iVar31 + iVar32 + iVar34;
  if (uVar46 != 0) {
    printf("Module xpath: %d errors\n",(ulong)uVar46);
  }
  return uVar46;
}

Assistant:

static int
test_xpath(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpath : 32 of 41 functions ...\n");
    test_ret += test_xmlXPathCastBooleanToNumber();
    test_ret += test_xmlXPathCastBooleanToString();
    test_ret += test_xmlXPathCastNodeSetToBoolean();
    test_ret += test_xmlXPathCastNodeSetToNumber();
    test_ret += test_xmlXPathCastNodeSetToString();
    test_ret += test_xmlXPathCastNodeToNumber();
    test_ret += test_xmlXPathCastNodeToString();
    test_ret += test_xmlXPathCastNumberToBoolean();
    test_ret += test_xmlXPathCastNumberToString();
    test_ret += test_xmlXPathCastStringToBoolean();
    test_ret += test_xmlXPathCastStringToNumber();
    test_ret += test_xmlXPathCastToBoolean();
    test_ret += test_xmlXPathCastToNumber();
    test_ret += test_xmlXPathCastToString();
    test_ret += test_xmlXPathCmpNodes();
    test_ret += test_xmlXPathCompile();
    test_ret += test_xmlXPathCompiledEval();
    test_ret += test_xmlXPathCompiledEvalToBoolean();
    test_ret += test_xmlXPathContextSetCache();
    test_ret += test_xmlXPathConvertBoolean();
    test_ret += test_xmlXPathConvertNumber();
    test_ret += test_xmlXPathConvertString();
    test_ret += test_xmlXPathCtxtCompile();
    test_ret += test_xmlXPathEval();
    test_ret += test_xmlXPathEvalExpression();
    test_ret += test_xmlXPathEvalPredicate();
    test_ret += test_xmlXPathInit();
    test_ret += test_xmlXPathIsInf();
    test_ret += test_xmlXPathIsNaN();
    test_ret += test_xmlXPathNewContext();
    test_ret += test_xmlXPathNodeEval();
    test_ret += test_xmlXPathNodeSetCreate();
    test_ret += test_xmlXPathObjectCopy();
    test_ret += test_xmlXPathOrderDocElems();
    test_ret += test_xmlXPathSetContextNode();
    test_ret += test_xmlXPathSetErrorHandler();

    if (test_ret != 0)
	printf("Module xpath: %d errors\n", test_ret);
    return(test_ret);
}